

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void llvm::yaml::ScalarTraits<llvm::yaml::Hex8,_void>::output
               (Hex8 *Val,void *param_2,raw_ostream *Out)

{
  raw_ostream *this;
  uint8_t *puVar1;
  format_object<unsigned_char> local_40;
  uint8_t local_21;
  raw_ostream *prStack_20;
  uint8_t Num;
  raw_ostream *Out_local;
  void *param_1_local;
  Hex8 *Val_local;
  
  prStack_20 = Out;
  Out_local = (raw_ostream *)param_2;
  param_1_local = Val;
  puVar1 = Hex8::operator_cast_to_unsigned_char_(Val);
  this = prStack_20;
  local_21 = *puVar1;
  format<unsigned_char>(&local_40,"0x%02X",&local_21);
  raw_ostream::operator<<(this,&local_40.super_format_object_base);
  return;
}

Assistant:

void ScalarTraits<Hex8>::output(const Hex8 &Val, void *, raw_ostream &Out) {
  uint8_t Num = Val;
  Out << format("0x%02X", Num);
}